

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_table.cpp
# Opt level: O0

void __thiscall InlineTable_Empty_Test::InlineTable_Empty_Test(InlineTable_Empty_Test *this)

{
  InlineTable_Empty_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__InlineTable_Empty_Test_00229ba8;
  return;
}

Assistant:

TEST(InlineTable, Empty) {
    std::istringstream input("key = {}");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::key, "key"},
        {sax_event_t::start_inline_table},
        {sax_event_t::finish_inline_table, 0},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}